

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvapeeki.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint32_t uVar1;
  void *pvVar2;
  bool bVar3;
  nva_card *pnVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  char *__ptr;
  uint uVar9;
  undefined1 *puVar10;
  long lVar11;
  size_t sStack_150;
  undefined1 auStack_148 [4];
  int32_t b;
  int32_t a;
  int cnum;
  uint32_t z [64];
  
  iVar6 = nva_init();
  if (iVar6 == 0) {
    cnum = 0;
    do {
      while (iVar6 = getopt(argc,argv,"c:"), iVar6 == 99) {
        __isoc99_sscanf(_optarg,"%d",&cnum);
      }
    } while (iVar6 != -1);
    if (cnum < nva_cardsnum) {
      b = 4;
      if (_optind < argc) {
        __isoc99_sscanf(argv[_optind],"%x",&a);
        a = a & 0xfffffffc;
        if (_optind + 1 < argc) {
          __isoc99_sscanf(argv[(long)_optind + 1],"%x",&b);
          iVar6 = b;
        }
        else {
          iVar6 = 4;
        }
        bVar3 = true;
        while (pnVar4 = nva_cards, 0 < iVar6) {
          uVar7 = 0;
          for (uVar8 = 0; pvVar2 = pnVar4[cnum].bar0, uVar8 != 0x40; uVar8 = uVar8 + 1) {
            *(int *)((long)pvVar2 + ((ulong)(uint)a | 0xffc)) = (int)uVar8;
            uVar1 = *(uint32_t *)((long)pnVar4[cnum].bar0 + (ulong)(uint)a);
            z[uVar8] = uVar1;
            uVar9 = 1 << ((byte)(uVar8 >> 2) & 0x1f);
            if (uVar1 == 0) {
              uVar9 = 0;
            }
            uVar7 = uVar7 | uVar9;
          }
          *(undefined4 *)((long)pvVar2 + ((ulong)(uint)a | 0xffc)) = 0;
          puVar10 = auStack_148;
          for (lVar11 = 0; puVar10 = puVar10 + 0x10, lVar11 != 0x10; lVar11 = lVar11 + 1) {
            if ((uVar7 >> ((uint)lVar11 & 0x1f) & 1) == 0) {
              bVar5 = false;
              if (bVar3) {
                puts("...");
              }
            }
            else {
              printf("%08x.%02x:",(ulong)(uint)a,(ulong)((uint)lVar11 << 4));
              for (uVar8 = 0; (uVar8 < 4 && ((long)uVar8 < (long)b)); uVar8 = uVar8 + 1) {
                printf(" %08x",(ulong)*(uint *)(puVar10 + uVar8 * 4));
              }
              putchar(10);
              bVar5 = true;
            }
            bVar3 = bVar5;
          }
          a = a + 4;
          b = b + -4;
          iVar6 = b;
        }
        return 0;
      }
      __ptr = "No address specified.\n";
      sStack_150 = 0x16;
    }
    else if (nva_cardsnum == 0) {
      __ptr = "No cards found.\n";
      sStack_150 = 0x10;
    }
    else {
      __ptr = "No such card.\n";
      sStack_150 = 0xe;
    }
  }
  else {
    __ptr = "PCI init failure!\n";
    sStack_150 = 0x12;
  }
  fwrite(__ptr,sStack_150,1,_stderr);
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	int32_t a, b = 4, i;
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);
	a &= ~3;
	if (optind + 1 < argc)
		sscanf (argv[optind + 1], "%x", &b);
	int ls = 1;
	while (b > 0) {
		uint32_t selector = a|0xffc;
		uint32_t z[0x40];
		int s = 0, j;
		for (i = 0; i < 0x40; i++) {
			nva_wr32(cnum, selector, i);
			if ((z[i] = nva_rd32(cnum, a))) s |= 1 << (i/4);
		}
		nva_wr32(cnum, selector, 0);
		for (j = 0; j < 0x10; ++j) {
			if (s & (1<<j)) {
				ls = 1;
				printf ("%08x.%02x:", a, j * 0x10);
				for (i = 0; i < 4 && i < b; i++) {
					printf (" %08x", z[i + j*4]);
				}
				printf ("\n");
			} else  {
				if (ls) printf ("...\n"), ls = 0;
			}
		}
		a+=4;
		b-=4;
	}
	return 0;
}